

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

Vec_Wec_t * Gia_Iso2ManCheckIsoClasses(Gia_Man_t *p,Vec_Wec_t *vEquivs)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vRoots_00;
  Vec_Int_t *vVec0_00;
  Vec_Int_t *vVec1_00;
  Vec_Int_t *vMap0_00;
  Vec_Int_t *vMap1_00;
  Vec_Int_t *vNewClass_00;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  uint local_68;
  int local_64;
  int Counter;
  int i;
  Vec_Int_t *vNewClass;
  Vec_Int_t *vClass2;
  Vec_Int_t *vClass;
  Vec_Int_t *vMap1;
  Vec_Int_t *vMap0;
  Vec_Int_t *vVec1;
  Vec_Int_t *vVec0;
  Vec_Int_t *vRoots;
  Vec_Wec_t *vEquivs2;
  Vec_Wec_t *vEquivs_local;
  Gia_Man_t *p_local;
  
  vRoots_00 = Vec_IntAlloc(10000);
  vVec0_00 = Vec_IntAlloc(10000);
  vVec1_00 = Vec_IntAlloc(10000);
  iVar1 = Gia_ManObjNum(p);
  vMap0_00 = Vec_IntStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  vMap1_00 = Vec_IntStart(iVar1);
  local_68 = 0;
  vNewClass_00 = Vec_IntAlloc(100);
  iVar1 = Vec_WecSize(vEquivs);
  p_00 = Vec_WecAlloc(iVar1 << 1);
  for (local_64 = 0; iVar1 = Vec_WecSize(vEquivs), local_64 < iVar1; local_64 = local_64 + 1) {
    pVVar3 = Vec_WecEntry(vEquivs,local_64);
    if (local_64 % 0x32 == 0) {
      uVar2 = Gia_ManPoNum(p);
      printf("Finished %8d outputs (out of %8d)...\r",(ulong)local_68,(ulong)uVar2);
      fflush(_stdout);
    }
    Gia_Iso2ManCheckIsoClassOne(p,pVVar3,vRoots_00,vVec0_00,vVec1_00,vMap0_00,vMap1_00,vNewClass_00)
    ;
    iVar1 = Vec_IntSize(pVVar3);
    local_68 = iVar1 + local_68;
    pVVar4 = Vec_WecPushLevel(p_00);
    iVar1 = pVVar3->nSize;
    pVVar4->nCap = pVVar3->nCap;
    pVVar4->nSize = iVar1;
    pVVar4->pArray = pVVar3->pArray;
    pVVar3->pArray = (int *)0x0;
    pVVar3->nCap = 0;
    pVVar3->nSize = 0;
    iVar1 = Vec_IntSize(vNewClass_00);
    if (iVar1 != 0) {
      pVVar3 = Vec_WecPushLevel(vEquivs);
      Vec_IntAppend(pVVar3,vNewClass_00);
    }
  }
  Vec_IntFree(vNewClass_00);
  Vec_IntFree(vRoots_00);
  Vec_IntFree(vVec0_00);
  Vec_IntFree(vVec1_00);
  Vec_IntFree(vMap0_00);
  Vec_IntFree(vMap1_00);
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_Iso2ManCheckIsoClasses( Gia_Man_t * p, Vec_Wec_t * vEquivs )
{
    Vec_Wec_t * vEquivs2;
    Vec_Int_t * vRoots = Vec_IntAlloc( 10000 );
    Vec_Int_t * vVec0 = Vec_IntAlloc( 10000 );
    Vec_Int_t * vVec1 = Vec_IntAlloc( 10000 );
    Vec_Int_t * vMap0 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMap1 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vClass, * vClass2, * vNewClass;
    int i, Counter = 0;
    vNewClass = Vec_IntAlloc( 100 );
    vEquivs2 = Vec_WecAlloc( 2 * Vec_WecSize(vEquivs) );
    Vec_WecForEachLevel( vEquivs, vClass, i )
    {
        if ( i % 50 == 0 )
            printf( "Finished %8d outputs (out of %8d)...\r", Counter, Gia_ManPoNum(p) ), fflush(stdout);
        // split this class
        Gia_Iso2ManCheckIsoClassOne( p, vClass, vRoots, vVec0, vVec1, vMap0, vMap1, vNewClass );
        Counter += Vec_IntSize(vClass);
        // add remaining class
        vClass2 = Vec_WecPushLevel( vEquivs2 );
        *vClass2 = *vClass;
        vClass->pArray = NULL;
        vClass->nSize = vClass->nCap = 0;
        // add new class
        if ( Vec_IntSize(vNewClass) == 0 )
            continue;
        vClass = Vec_WecPushLevel( vEquivs );
        Vec_IntAppend( vClass, vNewClass );
    }
    Vec_IntFree( vNewClass );   
    Vec_IntFree( vRoots );
    Vec_IntFree( vVec0 );
    Vec_IntFree( vVec1 );
    Vec_IntFree( vMap0 );
    Vec_IntFree( vMap1 );
    return vEquivs2;
}